

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.cpp
# Opt level: O2

void jbcoin::LogThrow(string *title)

{
  int iVar1;
  Stream local_1b0;
  ScopedStream local_1a0;
  
  debugLog();
  iVar1 = (*(local_1b0.m_sink)->_vptr_Sink[2])(local_1b0.m_sink,3);
  if ((char)iVar1 != '\0') {
    debugLog();
    local_1b0.m_level = kWarning;
    beast::Journal::ScopedStream::ScopedStream<std::__cxx11::string>(&local_1a0,&local_1b0,title);
    beast::Journal::ScopedStream::~ScopedStream(&local_1a0);
  }
  return;
}

Assistant:

void
LogThrow (std::string const& title)
{
    JLOG(debugLog().warn()) << title;
}